

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

Abc_Cex_t * Abc_CexMerge(Abc_Cex_t *pCex,Abc_Cex_t *pPart,int iFrBeg,int iFrEnd)

{
  uint uVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  
  if (iFrBeg < 0) {
    pcVar5 = "Starting frame is less than 0.";
  }
  else {
    if (-1 < iFrEnd) {
      uVar1 = pCex->iFrame;
      if ((int)uVar1 < iFrBeg) {
        pcVar5 = "Starting frame is more than the last frame of CEX (%d).\n";
      }
      else {
        if ((uint)iFrEnd <= uVar1) {
          if ((uint)iFrEnd < (uint)iFrBeg) {
            printf("Starting frame (%d) should be less than stopping frame (%d).\n",
                   (ulong)(uint)iFrBeg,(ulong)(uint)iFrEnd);
            return (Abc_Cex_t *)0x0;
          }
          if (pCex->nPis != pPart->nPis) {
            __assert_fail("pCex->nPis == pPart->nPis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                          ,0xd9,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
          }
          iVar9 = (iFrEnd - iFrBeg) + pPart->iPo;
          iVar10 = iVar9 - pPart->iFrame;
          if (iVar9 < pPart->iFrame) {
            __assert_fail("iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                          ,0xda,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
          }
          pAVar3 = Abc_CexAlloc(pCex->nRegs,pCex->nPis,(uVar1 - iVar10) + 1);
          pAVar3->iPo = pCex->iPo;
          iVar9 = pCex->iFrame;
          pAVar3->iFrame = iVar9 - iVar10;
          uVar1 = pCex->nRegs;
          uVar4 = 0;
          uVar2 = 0;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
            if (((uint)(&pCex[1].iPo)[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
              (&pAVar3[1].iPo)[uVar4 >> 5] =
                   (&pAVar3[1].iPo)[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
            }
          }
          for (iVar10 = 0; iVar10 != iFrBeg; iVar10 = iVar10 + 1) {
            iVar6 = pCex->nPis;
            iVar7 = 0;
            if (0 < iVar6) {
              iVar7 = iVar6;
            }
            uVar4 = iVar6 * iVar10 + uVar1;
            while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
              if (((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
                (&pAVar3[1].iPo)[uVar2 >> 5] =
                     (&pAVar3[1].iPo)[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
              }
              uVar2 = uVar2 + 1;
              uVar4 = uVar4 + 1;
            }
          }
          iVar6 = 0;
          iVar10 = pPart->iFrame;
          if (pPart->iFrame < 1) {
            iVar10 = iVar6;
          }
          for (; iVar6 != iVar10; iVar6 = iVar6 + 1) {
            iVar7 = pCex->nPis;
            iVar8 = 0;
            if (0 < iVar7) {
              iVar8 = iVar7;
            }
            iVar7 = iVar7 * iVar6;
            while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
              uVar4 = pPart->nRegs + iVar7;
              if (((uint)(&pPart[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
                (&pAVar3[1].iPo)[uVar2 >> 5] =
                     (&pAVar3[1].iPo)[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
              }
              uVar2 = uVar2 + 1;
              iVar7 = iVar7 + 1;
            }
          }
          for (; iFrEnd <= iVar9; iFrEnd = iFrEnd + 1) {
            iVar10 = pCex->nPis;
            iVar6 = 0;
            if (0 < iVar10) {
              iVar6 = iVar10;
            }
            uVar4 = iVar10 * iFrEnd + uVar1;
            while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
              if (((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
                (&pAVar3[1].iPo)[uVar2 >> 5] =
                     (&pAVar3[1].iPo)[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
              }
              uVar2 = uVar2 + 1;
              uVar4 = uVar4 + 1;
            }
          }
          if (uVar2 == pAVar3->nBits) {
            return pAVar3;
          }
          __assert_fail("iBit == pNew->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                        ,0xf0,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
        }
        pcVar5 = "Stopping frame is more than the last frame of CEX (%d).\n";
      }
      printf(pcVar5,(ulong)uVar1);
      return (Abc_Cex_t *)0x0;
    }
    pcVar5 = "Stopping frame is less than 0.";
  }
  puts(pcVar5);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Abc_CexMerge( Abc_Cex_t * pCex, Abc_Cex_t * pPart, int iFrBeg, int iFrEnd )
{
    Abc_Cex_t * pNew;
    int nFramesGain;
    int i, f, iBit;

    if ( iFrBeg < 0 )
        { printf( "Starting frame is less than 0.\n" ); return NULL; }
    if ( iFrEnd < 0 )
        { printf( "Stopping frame is less than 0.\n" ); return NULL; }
    if ( iFrBeg > pCex->iFrame )
        { printf( "Starting frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrEnd > pCex->iFrame )
        { printf( "Stopping frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrBeg > iFrEnd )
        { printf( "Starting frame (%d) should be less than stopping frame (%d).\n", iFrBeg, iFrEnd ); return NULL; }
    assert( iFrBeg >= 0 && iFrBeg <= pCex->iFrame );
    assert( iFrEnd >= 0 && iFrEnd <= pCex->iFrame );
    assert( iFrBeg <= iFrEnd );

    assert( pCex->nPis == pPart->nPis );
    assert( iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame );

    nFramesGain = iFrEnd - iFrBeg + pPart->iPo - pPart->iFrame;
    pNew = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 - nFramesGain );
    pNew->iPo    = pCex->iPo;
    pNew->iFrame = pCex->iFrame - nFramesGain;

    for ( iBit = 0; iBit < pCex->nRegs; iBit++ )
        if ( Abc_InfoHasBit(pCex->pData, iBit) )
            Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < iFrBeg; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < pPart->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pPart->pData, pPart->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    assert( iBit == pNew->nBits );

    return pNew;
}